

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturing.hpp
# Opt level: O0

Vector3<double> *
eos::render::detail::tex2d_linear<double>
          (Vector3<double> *__return_storage_ptr__,Vector2<double> *imageTexCoord,uchar mipmap_index
          ,Texture *texture)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CoeffReturnType pdVar5;
  const_reference pvVar6;
  Pixel<unsigned_char,_4> *pPVar7;
  byte *pbVar8;
  Scalar *pSVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 local_58;
  undefined4 local_54;
  int pixelIndexRow;
  int pixelIndexCol;
  float d;
  float c;
  float b;
  float a;
  float oneMinusBeta;
  float oneMinusAlpha;
  float beta;
  float alpha;
  int y;
  int x;
  Texture *texture_local;
  uchar mipmap_index_local;
  Vector2<double> *imageTexCoord_local;
  Vector3<double> *color;
  
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)imageTexCoord,0);
  iVar2 = (int)*pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)imageTexCoord,1);
  iVar3 = (int)*pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)imageTexCoord,0);
  fVar10 = (float)(*pdVar5 - (double)iVar2);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)imageTexCoord,1);
  fVar11 = (float)(*pdVar5 - (double)iVar3);
  fVar12 = (1.0 - fVar10) * (1.0 - fVar11);
  fVar13 = fVar10 * (1.0 - fVar11);
  fVar14 = (1.0 - fVar10) * fVar11;
  fVar10 = fVar10 * fVar11;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__);
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar6);
  local_54 = iVar2;
  if (iVar2 == iVar4) {
    local_54 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar6);
  local_58 = iVar3;
  if (iVar3 == iVar4) {
    local_58 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,0);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,0);
  *pSVar9 = (double)(fVar12 * (float)bVar1);
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,1);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,1);
  *pSVar9 = (double)(fVar12 * (float)bVar1);
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,2);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,2);
  *pSVar9 = (double)(fVar12 * (float)bVar1);
  local_54 = iVar2 + 1;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar6);
  if (local_54 == iVar4) {
    local_54 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar6);
  local_58 = iVar3;
  if (iVar3 == iVar4) {
    local_58 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,0);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,0);
  *pSVar9 = (double)(fVar13 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,1);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,1);
  *pSVar9 = (double)(fVar13 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,2);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,2);
  *pSVar9 = (double)(fVar13 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar6);
  local_54 = iVar2;
  if (iVar2 == iVar4) {
    local_54 = 0;
  }
  local_58 = iVar3 + 1;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar4 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar6);
  if (local_58 == iVar4) {
    local_58 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,0);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,0);
  *pSVar9 = (double)(fVar14 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,1);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,1);
  *pSVar9 = (double)(fVar14 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,2);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,2);
  *pSVar9 = (double)(fVar14 * (float)bVar1) + *pSVar9;
  local_54 = iVar2 + 1;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar2 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar6);
  if (local_54 == iVar2) {
    local_54 = 0;
  }
  local_58 = iVar3 + 1;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  iVar2 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar6);
  if (local_58 == iVar2) {
    local_58 = 0;
  }
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,0);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,0);
  *pSVar9 = (double)(fVar10 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,1);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,1);
  *pSVar9 = (double)(fVar10 * (float)bVar1) + *pSVar9;
  pvVar6 = std::
           vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
           ::operator[](&texture->mipmaps,(ulong)mipmap_index);
  pPVar7 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(pvVar6,local_58,local_54);
  pbVar8 = core::Pixel<unsigned_char,_4>::operator[](pPVar7,2);
  bVar1 = *pbVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      __return_storage_ptr__,2);
  *pSVar9 = (double)(fVar10 * (float)bVar1) + *pSVar9;
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::Vector3<T> tex2d_linear(const Eigen::Vector2<T>& imageTexCoord, unsigned char mipmap_index,
                                      const Texture& texture)
{
    const int x = (int)imageTexCoord[0];
    const int y = (int)imageTexCoord[1];
    const float alpha = imageTexCoord[0] - x;
    const float beta = imageTexCoord[1] - y;
    const float oneMinusAlpha = 1.0f - alpha;
    const float oneMinusBeta = 1.0f - beta;
    const float a = oneMinusAlpha * oneMinusBeta;
    const float b = alpha * oneMinusBeta;
    const float c = oneMinusAlpha * beta;
    const float d = alpha * beta;
    Eigen::Vector3<T> color;

    // int pixelIndex;
    // pixelIndex = getPixelIndex_wrap(x, y, texture->mipmaps[mipmapIndex].cols,
    // texture->mipmaps[mipmapIndex].rows);
    int pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    int pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    // std::cout << texture.mipmaps[mipmapIndex].cols << " " << texture.mipmaps[mipmapIndex].rows << " " <<
    // texture.mipmaps[mipmapIndex].channels() << std::endl;  cv::imwrite("mm.png",
    // texture.mipmaps[mipmapIndex]);
    color[0] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] = a * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += b * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += c * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    // pixelIndex = getPixelIndex_wrap(x + 1, y + 1, texture.mipmaps[mipmapIndex].cols,
    // texture.mipmaps[mipmapIndex].rows);
    pixelIndexCol = x + 1;
    if (pixelIndexCol == texture.mipmaps[mipmap_index].width())
    {
        pixelIndexCol = 0;
    }
    pixelIndexRow = y + 1;
    if (pixelIndexRow == texture.mipmaps[mipmap_index].height())
    {
        pixelIndexRow = 0;
    }
    color[0] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[0];
    color[1] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[1];
    color[2] += d * texture.mipmaps[mipmap_index](pixelIndexRow, pixelIndexCol)[2];

    return color;
}